

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChIterativeSolverLS.cpp
# Opt level: O2

bool __thiscall
chrono::ChIterativeSolverLS::Setup(ChIterativeSolverLS *this,ChSystemDescriptor *sysd)

{
  ChVectorDynamic<double> *this_00;
  double dVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  Scalar *pSVar5;
  long N;
  ulong index;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double local_48;
  
  iVar2 = (*sysd->_vptr_ChSystemDescriptor[7])(sysd);
  iVar3 = (*sysd->_vptr_ChSystemDescriptor[8])(sysd);
  uVar4 = iVar3 + iVar2;
  N = (long)(int)uVar4;
  ChMatrixSPMV::Setup(this->m_spmv,N,sysd);
  if ((this->super_ChIterativeSolver).m_use_precond == true) {
    this_00 = &this->m_invdiag;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,N);
    (*sysd->_vptr_ChSystemDescriptor[0xf])(sysd,this_00);
    for (index = 0; (~((int)uVar4 >> 0x1f) & uVar4) != index; index = index + 1) {
      pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_00,
                          index);
      auVar7._8_8_ = 0;
      auVar7._0_8_ = *pSVar5;
      auVar6._8_8_ = 0x7fffffffffffffff;
      auVar6._0_8_ = 0x7fffffffffffffff;
      auVar6 = vandpd_avx512vl(auVar7,auVar6);
      pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_00,
                          index);
      local_48 = auVar6._0_8_;
      if (local_48 <= 1e-09) {
        *pSVar5 = 1.0;
      }
      else {
        dVar1 = *pSVar5;
        pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_00,
                            index);
        *pSVar5 = 1.0 / dVar1;
      }
    }
  }
  if ((this->super_ChIterativeSolver).m_warm_start == true) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&(this->m_initguess).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,N
              );
    (*sysd->_vptr_ChSystemDescriptor[0x14])(sysd,&this->m_initguess,1);
  }
  iVar2 = (*(this->super_ChIterativeSolver)._vptr_ChIterativeSolver[7])(this);
  return SUB41(iVar2,0);
}

Assistant:

bool ChIterativeSolverLS::Setup(ChSystemDescriptor& sysd) {
    // Calculate problem size
    int dim = sysd.CountActiveVariables() + sysd.CountActiveConstraints();

    // Set up the SPMV wrapper
    m_spmv->Setup(dim, sysd);

    // If needed, evaluate the inverse diagonal entries
    if (m_use_precond) {
        m_invdiag.resize(dim);
        sysd.BuildDiagonalVector(m_invdiag);
        for (int i = 0; i < dim; i++) {
            if (std::abs(m_invdiag(i)) > 1e-9)
                m_invdiag(i) = 1.0 / m_invdiag(i);
            else
                m_invdiag(i) = 1.0;
        }
    }

    // If needed, evaluate the initial guess
    if (m_warm_start) {
        m_initguess.resize(dim);
        sysd.FromUnknownsToVector(m_initguess);
    }

    // Let the concrete solver initialize itself
    bool result = SetupProblem();

    //// ---- DEBUGGING
    ////SaveMatrix(sysd);
    //// ---- DEBUGGING

    return result;
}